

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O0

void __thiscall ANN::load(ANN *this,string *filepath,bool reinitialize)

{
  pointer *this_00;
  uint n_row;
  byte bVar1;
  uint uVar2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  Matrix *pMVar6;
  double *pdVar7;
  double dVar8;
  uint local_448;
  uint local_444;
  uint k_1;
  uint k;
  uint j;
  uint i_1;
  uint i;
  long local_428;
  ifstream file;
  undefined1 local_220 [8];
  Matrix weight;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n_weights;
  vector<unsigned_int,_std::allocator<unsigned_int>_> n_perceptrons;
  undefined1 local_1c8 [4];
  uint n_layer;
  string line;
  stringstream stream;
  bool reinitialize_local;
  string *filepath_local;
  ANN *this_local;
  
  std::__cxx11::stringstream::stringstream((stringstream *)(line.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_1c8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             &n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&weight.m_shape);
  Matrix::Matrix((Matrix *)local_220);
  std::ifstream::ifstream(&local_428,filepath,8);
  bVar1 = std::ios::operator!((ios *)((long)&local_428 + *(long *)(local_428 + -0x18)));
  if ((bVar1 & 1) == 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&local_428,(string *)local_1c8);
    uVar2 = std::__cxx11::stoi((string *)local_1c8,(size_t *)0x0,10);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ulong)uVar2);
    if (reinitialize) {
      std::vector<Layer,_std::allocator<Layer>_>::clear(&this->m_layers);
    }
    for (j = 0; j < uVar2; j = j + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_428,(string *)local_1c8,',');
      vVar3 = std::__cxx11::stoi((string *)local_1c8,(size_t *)0x0,10);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)j);
      *pvVar4 = vVar3;
      if (reinitialize) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &n_weights.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)j);
        insert_layer(this,j,*pvVar4);
      }
    }
    for (k = 0; k < uVar2 - 1; k = k + 1) {
      if (reinitialize) {
        pvVar5 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)k);
        pMVar6 = Layer::weights(pvVar5);
        this_00 = &n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,
                            (ulong)(k + 1));
        n_row = *pvVar4;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,(ulong)k)
        ;
        Matrix::set_shape(pMVar6,n_row,*pvVar4);
        pvVar5 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)k);
        pMVar6 = Layer::biases(pvVar5);
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &n_weights.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)(k + 1));
        Matrix::set_shape(pMVar6,1,*pvVar4);
      }
      k_1 = 0;
      while( true ) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &n_weights.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)(k + 1));
        if (*pvVar4 <= k_1) break;
        local_444 = 0;
        while( true ) {
          pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              &n_weights.
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)k);
          if (*pvVar4 <= local_444) break;
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&local_428,(string *)local_1c8,',');
          dVar8 = std::__cxx11::stod((string *)local_1c8,(size_t *)0x0);
          pvVar5 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)k);
          pMVar6 = Layer::weights(pvVar5);
          pdVar7 = Matrix::set(pMVar6,k_1,local_444);
          *pdVar7 = dVar8;
          local_444 = local_444 + 1;
        }
        k_1 = k_1 + 1;
      }
      local_448 = 0;
      while( true ) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                            &n_weights.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage,(ulong)(k + 1));
        if (*pvVar4 <= local_448) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&local_428,(string *)local_1c8,',');
        dVar8 = std::__cxx11::stod((string *)local_1c8,(size_t *)0x0);
        pvVar5 = std::vector<Layer,_std::allocator<Layer>_>::operator[](&this->m_layers,(ulong)k);
        pMVar6 = Layer::biases(pvVar5);
        pdVar7 = Matrix::set(pMVar6,0,local_448);
        *pdVar7 = dVar8;
        local_448 = local_448 + 1;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&local_428,(string *)local_1c8);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(&local_428);
    Matrix::~Matrix((Matrix *)local_220);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&weight.m_shape);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &n_weights.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)(line.field_2._M_local_buf + 8));
    return;
  }
  std::operator<<((ostream *)&std::cout,"ERROR [weight file]: Couldn\'t load weights!\n");
  exit(1);
}

Assistant:

void ANN::load(const std::string& filepath, bool reinitialize){
    std::stringstream stream;
    std::string line;
    uint n_layer;
    std::vector<uint> n_perceptrons, n_weights;
    Matrix weight;

    std::ifstream file(filepath);

    if(!file){
        std::cout<<"ERROR [weight file]: Couldn't load weights!\n";
        exit(1);
    }

    std::getline(file, line);
    n_layer=std::stoi(line);
    n_perceptrons.resize(n_layer);

    if(reinitialize) m_layers.clear();
    for(uint i=0;i<n_layer;++i){
        std::getline(file, line, ',');
        n_perceptrons[i]=std::stoi(line);
        if(reinitialize) insert_layer(i, n_perceptrons[i]);
    }

    for(uint i=0;i<n_layer-1;++i){
        if(reinitialize){
            m_layers[i].weights().set_shape(n_perceptrons[i+1], n_perceptrons[i]);
            m_layers[i].biases().set_shape(1, n_perceptrons[i+1]);
        }
        for(uint j=0;j<n_perceptrons[i+1];++j){
            for(uint k=0;k<n_perceptrons[i];++k){
                std::getline(file, line, ',');
                m_layers[i].weights().set(j, k)=std::stod(line);
            }
        }
        for(uint k=0;k<n_perceptrons[i+1];++k){
            std::getline(file, line, ',');
            m_layers[i].biases().set(0, k)=std::stod(line);
        }   std::getline(file, line);
    }

    file.close();
}